

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O3

Var Js::DataView::EntryGetterByteOffset(RecyclableObject *function,CallInfo callInfo,...)

{
  uint uVar1;
  ScriptContext *pSVar2;
  ArrayBufferBase *pAVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Var pvVar7;
  DataView *pDVar8;
  uint64 uVar9;
  uint64 uVar10;
  undefined1 *puVar11;
  int32 hCode;
  double value;
  int in_stack_00000010;
  CallInfo local_40;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x2d2,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00b3a06e;
    *puVar6 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_40);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x2d5,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00b3a06e;
    *puVar6 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    bVar5 = VarIs<Js::DataView>(pvVar7);
    if (bVar5) {
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      pDVar8 = VarTo<Js::DataView>(pvVar7);
      pAVar3 = (pDVar8->super_ArrayBufferParent).arrayBuffer.ptr;
      if (pAVar3 != (ArrayBufferBase *)0x0) {
        puVar11 = &DAT_1000000000000;
        if (pAVar3->isDetached == false) {
          uVar1 = pDVar8->byteOffset;
          if ((long)(int)uVar1 < 0) {
            value = (double)uVar1;
            uVar9 = NumberUtilities::ToSpecial(value);
            bVar5 = NumberUtilities::IsNan(value);
            if (bVar5) {
              uVar10 = NumberUtilities::ToSpecial(value);
              if (uVar10 != 0xfff8000000000000) {
                uVar10 = NumberUtilities::ToSpecial(value);
                if (uVar10 != 0x7ff8000000000000) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                  *puVar6 = 1;
                  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                              ,0xa2,
                                              "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                              ,"We should only produce a NaN with this value");
                  if (!bVar5) {
LAB_00b3a06e:
                    pcVar4 = (code *)invalidInstructionException();
                    (*pcVar4)();
                  }
                  *puVar6 = 0;
                }
              }
            }
            puVar11 = (undefined1 *)(uVar9 ^ 0xfffc000000000000);
          }
          else {
            puVar11 = (undefined1 *)((long)(int)uVar1 | 0x1000000000000);
          }
        }
        return puVar11;
      }
      hCode = -0x7ff5ea1c;
      goto LAB_00b3a078;
    }
  }
  hCode = -0x7ff5ec21;
LAB_00b3a078:
  JavascriptError::ThrowTypeError(pSVar2,hCode,(PCWSTR)0x0);
}

Assistant:

Var DataView::EntryGetterByteOffset(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<DataView>(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDataView);
        }

        DataView* dataView = VarTo<DataView>(args[0]);
        ArrayBufferBase* arrayBuffer = dataView->GetArrayBuffer();

        if (arrayBuffer == nullptr)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject);
        }
        else if (arrayBuffer->IsDetached())
        {
            return TaggedInt::ToVarUnchecked(0);
        }

        return JavascriptNumber::ToVar(dataView->GetByteOffset(), scriptContext);
    }